

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::RunningTest::ranToCompletion(RunningTest *this)

{
  RunningSection *this_00;
  bool bVar1;
  
  this->m_runStatus = RanToCompletionWithSections;
  this_00 = this->m_lastSectionToRun;
  if (this_00 != (RunningSection *)0x0) {
    if (this_00->m_state == Branch) {
      bVar1 = RunningSection::hasUntestedSections(this_00);
      if (!bVar1) {
        this_00->m_state = TestedBranch;
      }
    }
    this->m_changed = true;
  }
  return;
}

Assistant:

void ranToCompletion() {
            if( m_runStatus != RanAtLeastOneSection && m_runStatus != EncounteredASection )
                m_runStatus = RanToCompletionWithNoSections;
            m_runStatus = RanToCompletionWithSections;
            if( m_lastSectionToRun ) {
                m_lastSectionToRun->ranToCompletion();
                m_changed = true;
            }
        }